

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

UCVarValue FColorCVar::FromInt2(int value,ECVarType type)

{
  UCVarValue UVar1;
  
  if (type == CVAR_String) {
    mysnprintf(cstrbuf,0x28,"%02x %02x %02x",(ulong)((uint)value >> 0x10 & 0xff),
               (ulong)((uint)value >> 8 & 0xff),(ulong)(value & 0xff));
    return (UCVarValue)cstrbuf;
  }
  UVar1 = FBaseCVar::FromInt(value,type);
  return (UCVarValue)UVar1.String;
}

Assistant:

UCVarValue FColorCVar::FromInt2 (int value, ECVarType type)
{
	if (type == CVAR_String)
	{
		UCVarValue ret;
		mysnprintf (cstrbuf, countof(cstrbuf), "%02x %02x %02x",
			RPART(value), GPART(value), BPART(value));
		ret.String = cstrbuf;
		return ret;
	}
	return FromInt (value, type);
}